

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_install.cpp
# Opt level: O2

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true> *
duckdb::ExtensionHelper::PathComponents_abi_cxx11_(void)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDI;
  long lVar1;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  allocator_type local_51;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50 [2];
  
  GetVersionDirectoryName_abi_cxx11_();
  DuckDB::Platform_abi_cxx11_();
  __l._M_len = 2;
  __l._M_array = local_50;
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(in_RDI,__l,&local_51);
  lVar1 = 0x20;
  do {
    ::std::__cxx11::string::~string((string *)((long)&local_50[0]._M_dataplus._M_p + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  return (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
          *)in_RDI;
}

Assistant:

const vector<string> ExtensionHelper::PathComponents() {
	return vector<string> {GetVersionDirectoryName(), DuckDB::Platform()};
}